

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O1

u32 crc32_x86_pclmulqdq(u32 crc,u8 *p,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar63;
  size_t sVar64;
  ulong uVar65;
  u8 *puVar66;
  undefined1 (*pauVar67) [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar77 [16];
  
  auVar68 = ZEXT416(crc);
  if (len < 0x80) {
    if (len < 0x10) {
      if (len != 0) {
        sVar64 = 0;
        uVar65 = (ulong)crc;
        do {
          crc = (uint)(uVar65 >> 8) ^ crc32_slice1_table[(uint)p[sVar64] ^ crc & 0xff];
          uVar65 = (ulong)crc;
          sVar64 = sVar64 + 1;
        } while (len != sVar64);
        return crc;
      }
      return crc;
    }
    auVar69 = *(undefined1 (*) [16])p ^ auVar68;
    if (len < 0x20) {
      pauVar67 = (undefined1 (*) [16])(p + 0x10);
      goto LAB_0010d48b;
    }
    auVar68 = *(undefined1 (*) [16])(p + 0x10);
    if (0x3f < len) {
      auVar71 = *(undefined1 (*) [16])(p + 0x20);
      auVar72 = *(undefined1 (*) [16])(p + 0x30);
      pauVar67 = (undefined1 (*) [16])(p + 0x40);
      goto LAB_0010d3a4;
    }
    pauVar67 = (undefined1 (*) [16])(p + 0x20);
  }
  else {
    if ((len < 0x10001) || (((ulong)p & 0xf) == 0)) {
      auVar68 = *(undefined1 (*) [16])p ^ auVar68;
    }
    else {
      uVar63 = -(int)p & 0xf;
      uVar65 = (ulong)uVar63;
      auVar68 = *(undefined1 (*) [16])p ^ auVar68;
      puVar66 = p + 0x10;
      if (uVar63 != 0) {
        auVar72 = pshufb(auVar68,*(undefined1 (*) [16])(shift_tab + uVar65));
        auVar68 = pshufb(auVar68,*(undefined1 (*) [16])(shift_tab + uVar65 + 0x10));
        auVar71 = pblendvb(auVar68,*(undefined1 (*) [16])(p + uVar65),
                           *(undefined1 (*) [16])(shift_tab + uVar65 + 0x10));
        puVar66 = puVar66 + uVar65;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = auVar72._0_8_;
        auVar70 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((ZEXT816(0xae689191) & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar70 = auVar70 ^ auVar68 << uVar63;
          }
        }
        auVar73._8_8_ = 0;
        auVar73._0_8_ = auVar72._8_8_;
        auVar68 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar73 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar68 = auVar68 ^ ZEXT816(0xccaa009e) << uVar63;
          }
        }
        auVar68 = auVar68 ^ auVar70 ^ auVar71;
      }
      len = len - uVar65;
      p = puVar66 + -0x10;
    }
    auVar70 = *(undefined1 (*) [16])((long)p + 0x10);
    auVar71 = *(undefined1 (*) [16])((long)p + 0x20);
    auVar72 = *(undefined1 (*) [16])((long)p + 0x30);
    auVar73 = *(undefined1 (*) [16])((long)p + 0x40);
    auVar76 = *(undefined1 (*) [16])((long)p + 0x50);
    auVar75 = *(undefined1 (*) [16])((long)p + 0x60);
    auVar74 = *(undefined1 (*) [16])((long)p + 0x70);
    pauVar67 = (undefined1 (*) [16])((long)p + 0x80);
    if (0xff < len) {
      auVar77 = pmovzxdq(in_XMM9,0x910eeec1910eeec1);
      do {
        p = (u8 *)pauVar67;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = auVar68._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar1 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar20._8_8_ = 0;
        auVar20._0_8_ = auVar68._8_8_;
        uVar65 = auVar77._8_8_;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar65;
        auVar68 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar20 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar68 = auVar68 ^ auVar40 << uVar63;
          }
        }
        auVar68 = auVar68 ^ *(undefined1 (*) [16])p ^ auVar69;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = auVar70._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar2 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar21._8_8_ = 0;
        auVar21._0_8_ = auVar70._8_8_;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar65;
        auVar70 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar21 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar70 = auVar70 ^ auVar41 << uVar63;
          }
        }
        auVar70 = auVar70 ^ auVar69 ^ *(undefined1 (*) [16])((long)p + 0x10);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auVar71._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar3 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auVar71._8_8_;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar65;
        auVar71 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar22 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar71 = auVar71 ^ auVar42 << uVar63;
          }
        }
        auVar71 = auVar71 ^ auVar69 ^ *(undefined1 (*) [16])((long)p + 0x20);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auVar72._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar4 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auVar72._8_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar65;
        auVar72 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar23 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar72 = auVar72 ^ auVar43 << uVar63;
          }
        }
        auVar72 = auVar72 ^ auVar69 ^ *(undefined1 (*) [16])((long)p + 0x30);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auVar73._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar5 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar24._8_8_ = 0;
        auVar24._0_8_ = auVar73._8_8_;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar65;
        auVar73 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar24 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar73 = auVar73 ^ auVar44 << uVar63;
          }
        }
        auVar73 = auVar73 ^ auVar69 ^ *(undefined1 (*) [16])((long)p + 0x40);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auVar76._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar6 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar25._8_8_ = 0;
        auVar25._0_8_ = auVar76._8_8_;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar65;
        auVar76 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar25 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar76 = auVar76 ^ auVar45 << uVar63;
          }
        }
        auVar76 = auVar76 ^ auVar69 ^ *(undefined1 (*) [16])((long)p + 0x50);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auVar75._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar7 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar26._8_8_ = 0;
        auVar26._0_8_ = auVar75._8_8_;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar65;
        auVar75 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar26 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar75 = auVar75 ^ auVar46 << uVar63;
          }
        }
        auVar75 = auVar75 ^ auVar69 ^ *(undefined1 (*) [16])((long)p + 0x60);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar74._0_8_;
        auVar69 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar8 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar69 = auVar69 ^ ZEXT816(0x33fff533) << uVar63;
          }
        }
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auVar74._8_8_;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar65;
        auVar74 = (undefined1  [16])0x0;
        for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
          if ((auVar27 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
            auVar74 = auVar74 ^ auVar47 << uVar63;
          }
        }
        auVar74 = auVar74 ^ auVar69 ^ *(undefined1 (*) [16])((long)p + 0x70);
        len = len - 0x80;
        pauVar67 = (undefined1 (*) [16])((long)p + 0x80);
      } while (0xff < len);
    }
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auVar68._0_8_;
    auVar77 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar69 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar77 = auVar77 ^ ZEXT816(0x8f352d95) << uVar63;
      }
    }
    auVar69 = pmovsxdq(auVar73,0x1d9513d71d9513d7);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auVar68._8_8_;
    uVar65 = auVar69._8_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar65;
    auVar69 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar28 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar69 = auVar69 ^ auVar48 << uVar63;
      }
    }
    auVar69 = auVar69 ^ auVar77 ^ auVar73;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auVar70._0_8_;
    auVar73 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar77 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar73 = auVar73 ^ ZEXT816(0x8f352d95) << uVar63;
      }
    }
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auVar70._8_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar65;
    auVar68 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar29 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar68 = auVar68 ^ auVar70 << uVar63;
      }
    }
    auVar68 = auVar68 ^ auVar73 ^ auVar76;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auVar71._0_8_;
    auVar70 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar76 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar70 = auVar70 ^ ZEXT816(0x8f352d95) << uVar63;
      }
    }
    auVar30._8_8_ = 0;
    auVar30._0_8_ = auVar71._8_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar65;
    auVar71 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar30 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar71 = auVar71 ^ auVar49 << uVar63;
      }
    }
    auVar71 = auVar71 ^ auVar70 ^ auVar75;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auVar72._0_8_;
    auVar70 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar75 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar70 = auVar70 ^ ZEXT816(0x8f352d95) << uVar63;
      }
    }
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auVar72._8_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar65;
    auVar72 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar31 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar72 = auVar72 ^ auVar50 << uVar63;
      }
    }
    auVar72 = auVar72 ^ auVar70 ^ auVar74;
    if ((len & 0x40) != 0) {
      auVar74._8_8_ = 0;
      auVar74._0_8_ = auVar69._0_8_;
      auVar70 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar74 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar70 = auVar70 ^ ZEXT816(0x8f352d95) << uVar63;
        }
      }
      auVar32._8_8_ = 0;
      auVar32._0_8_ = auVar69._8_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar65;
      auVar69 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar32 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar69 = auVar69 ^ auVar51 << uVar63;
        }
      }
      auVar69 = auVar69 ^ auVar70 ^ *pauVar67;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar68._0_8_;
      auVar70 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar9 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar70 = auVar70 ^ ZEXT816(0x8f352d95) << uVar63;
        }
      }
      auVar33._8_8_ = 0;
      auVar33._0_8_ = auVar68._8_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar65;
      auVar68 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar33 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar68 = auVar68 ^ auVar52 << uVar63;
        }
      }
      auVar68 = auVar68 ^ *(undefined1 (*) [16])((long)p + 0x90) ^ auVar70;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auVar71._0_8_;
      auVar70 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar10 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar70 = auVar70 ^ ZEXT816(0x8f352d95) << uVar63;
        }
      }
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auVar71._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar65;
      auVar71 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar34 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar71 = auVar71 ^ auVar53 << uVar63;
        }
      }
      auVar71 = auVar71 ^ auVar70 ^ *(undefined1 (*) [16])((long)p + 0xa0);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auVar72._0_8_;
      auVar70 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((ZEXT816(0x8f352d95) & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar70 = auVar70 ^ auVar13 << uVar63;
        }
      }
      auVar35._8_8_ = 0;
      auVar35._0_8_ = auVar72._8_8_;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar65;
      auVar72 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar35 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar72 = auVar72 ^ auVar54 << uVar63;
        }
      }
      auVar72 = auVar72 ^ auVar70 ^ *(undefined1 (*) [16])((long)p + 0xb0);
      pauVar67 = (undefined1 (*) [16])((long)p + 0xc0);
    }
LAB_0010d3a4:
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar69._0_8_;
    auVar70 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar11 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar70 = auVar70 ^ ZEXT816(0xf1da05aa) << uVar63;
      }
    }
    auVar73 = pmovzxdq(auVar71,0x8125652781256527);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auVar69._8_8_;
    uVar65 = auVar73._8_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar65;
    auVar69 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar36 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar69 = auVar69 ^ auVar55 << uVar63;
      }
    }
    auVar69 = auVar69 ^ auVar70 ^ auVar71;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auVar68._0_8_;
    auVar70 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar71 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar70 = auVar70 ^ ZEXT816(0xf1da05aa) << uVar63;
      }
    }
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auVar68._8_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar65;
    auVar68 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar37 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar68 = auVar68 ^ auVar56 << uVar63;
      }
    }
    auVar68 = auVar68 ^ auVar70 ^ auVar72;
    if ((len & 0x20) != 0) {
      auVar72._8_8_ = 0;
      auVar72._0_8_ = auVar69._0_8_;
      auVar70 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar72 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar70 = auVar70 ^ ZEXT816(0xf1da05aa) << uVar63;
        }
      }
      auVar38._8_8_ = 0;
      auVar38._0_8_ = auVar69._8_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar65;
      auVar69 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar38 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar69 = auVar69 ^ auVar57 << uVar63;
        }
      }
      auVar69 = auVar69 ^ *pauVar67 ^ auVar70;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = auVar68._0_8_;
      auVar70 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((ZEXT816(0xf1da05aa) & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar70 = auVar70 ^ auVar14 << uVar63;
        }
      }
      auVar39._8_8_ = 0;
      auVar39._0_8_ = auVar68._8_8_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar65;
      auVar68 = (undefined1  [16])0x0;
      for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
        if ((auVar39 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
          auVar68 = auVar68 ^ auVar58 << uVar63;
        }
      }
      auVar68 = auVar68 ^ auVar70 ^ pauVar67[1];
      pauVar67 = pauVar67 + 2;
    }
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar69._0_8_;
  auVar70 = (undefined1  [16])0x0;
  for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
    if ((auVar12 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
      auVar70 = auVar70 ^ ZEXT816(0xae689191) << uVar63;
    }
  }
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar69._8_8_;
  auVar69 = (undefined1  [16])0x0;
  for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
    if ((auVar59 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
      auVar69 = auVar69 ^ ZEXT816(0xccaa009e) << uVar63;
    }
  }
  auVar69 = auVar69 ^ auVar70 ^ auVar68;
  if ((len & 0x10) != 0) {
    auVar68 = *pauVar67;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auVar69._0_8_;
    auVar70 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((ZEXT816(0xae689191) & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar70 = auVar70 ^ auVar15 << uVar63;
      }
    }
    auVar60._8_8_ = 0;
    auVar60._0_8_ = auVar69._8_8_;
    auVar69 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar60 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar69 = auVar69 ^ ZEXT816(0xccaa009e) << uVar63;
      }
    }
    auVar69 = auVar69 ^ auVar70 ^ auVar68;
    pauVar67 = pauVar67 + 1;
  }
LAB_0010d48b:
  uVar65 = len & 0xf;
  if (uVar65 != 0) {
    auVar68 = pshufb(auVar69,*(undefined1 (*) [16])(shift_tab + uVar65 + 0x10));
    auVar70 = pblendvb(auVar68,*(undefined1 (*) [16])(pauVar67[-1] + uVar65),
                       *(undefined1 (*) [16])(shift_tab + uVar65 + 0x10));
    auVar71 = pshufb(auVar69,*(undefined1 (*) [16])(shift_tab + uVar65));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auVar71._0_8_;
    auVar68 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((ZEXT816(0xae689191) & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar68 = auVar68 ^ auVar16 << uVar63;
      }
    }
    auVar68 = auVar68 ^ auVar70;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auVar71._8_8_;
    auVar69 = (undefined1  [16])0x0;
    for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
      if ((auVar61 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
        auVar69 = auVar69 ^ ZEXT816(0xccaa009e) << uVar63;
      }
    }
    auVar69 = auVar69 ^ auVar68;
  }
  auVar68 = pmovzxdq(auVar68,0xccaa009eccaa009e);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar68._8_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar69._0_8_;
  auVar68 = (undefined1  [16])0x0;
  for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
    if ((auVar18 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
      auVar68 = auVar68 ^ auVar19 << uVar63;
    }
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SUB168(auVar69 >> 0x40 ^ auVar68,0);
  auVar70 = (undefined1  [16])0x0;
  for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
    if ((ZEXT816(0xb4e5b025f7011641) & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
      auVar70 = auVar70 ^ auVar17 << uVar63;
    }
  }
  auVar62._8_8_ = 0;
  auVar62._0_8_ = auVar70._0_8_;
  auVar70 = (undefined1  [16])0x0;
  for (uVar63 = 0; uVar63 < 0x40; uVar63 = uVar63 + 1) {
    if ((auVar62 & (undefined1  [16])0x1 << uVar63) != (undefined1  [16])0x0) {
      auVar70 = auVar70 ^ ZEXT816(0x1db710641) << uVar63;
    }
  }
  return auVar70._8_4_ ^ auVar68._8_4_;
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}